

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::FsNode::Metadata> * __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryLstat
          (Maybe<kj::FsNode::Metadata> *__return_storage_ptr__,InMemoryDirectory *this,PathPtr path)

{
  int iVar1;
  long lVar2;
  Disposer DVar3;
  size_t sVar4;
  stat *__buf;
  char *pcVar5;
  uint64_t uVar6;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> local_68;
  uint64_t local_58;
  long lStack_50;
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  FsNode local_38;
  Disposer local_30;
  
  sVar4 = path.parts.size_;
  __buf = (stat *)path.parts.ptr;
  if (sVar4 != 1) {
    if (sVar4 == 0) {
      stat((InMemoryDirectory *)&(__return_storage_ptr__->ptr).field_1.value,(char *)this,__buf);
      (__return_storage_ptr__->ptr).isSet = true;
      return __return_storage_ptr__;
    }
    if (__buf->st_ino == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)__buf->st_dev;
    }
    name_00.content.size_ = (size_t)pcVar5;
    name_00.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)&stack0xffffffffffffffc8,name_00);
    DVar3._vptr_Disposer = local_30._vptr_Disposer;
    local_68.disposer = (Disposer *)local_38._vptr_FsNode;
    local_68.ptr = (ReadableDirectory *)local_30._vptr_Disposer;
    local_30._vptr_Disposer = (_func_int **)0x0;
    Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose
              ((Own<const_kj::ReadableDirectory,_std::nullptr_t> *)&stack0xffffffffffffffc8);
    if ((Waiter *)DVar3._vptr_Disposer == (Waiter *)0x0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      (**(code **)(*DVar3._vptr_Disposer + 0x48))
                (__return_storage_ptr__,DVar3._vptr_Disposer,&__buf->st_mode,sVar4 - 1);
    }
    Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose(&local_68);
    return __return_storage_ptr__;
  }
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
             &stack0xffffffffffffffc8,&this->impl);
  if (__buf->st_ino == 0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = (char *)__buf->st_dev;
  }
  name.content.size_ = (size_t)pcVar5;
  name.content.ptr = (char *)local_30._vptr_Disposer;
  Impl::tryGetEntry((Impl *)&local_68,name);
  if ((Clock *)local_68.disposer == (Clock *)0x0) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    iVar1 = *(int *)((long)local_68.disposer + 0x18);
    if (iVar1 == 3) {
      lVar2 = *(long *)((long)local_68.disposer + 0x20);
      uVar6 = *(uint64_t *)((long)local_68.disposer + 0x30);
      if (uVar6 != 0) {
        uVar6 = *(uint64_t *)((long)local_68.disposer + 0x28);
      }
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.type = SYMLINK;
      (__return_storage_ptr__->ptr).field_1.value.size = 0;
      (__return_storage_ptr__->ptr).field_1.value.spaceUsed = 0;
      (__return_storage_ptr__->ptr).field_1.value.lastModified.value.value = lVar2;
      (__return_storage_ptr__->ptr).field_1.value.linkCount = 1;
      (__return_storage_ptr__->ptr).field_1.value.hashCode = uVar6;
    }
    else {
      if (iVar1 == 2) {
        (**(code **)(**(long **)((long)local_68.disposer + 0x28) + 0x10))(&local_68);
      }
      else {
        if (iVar1 != 1) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
                    ((Fault *)&local_68,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x429,FAILED,(char *)0x0,"\"unknown node type\"",
                     (char (*) [18])"unknown node type");
          (__return_storage_ptr__->ptr).isSet = false;
          _::Debug::Fault::~Fault((Fault *)&local_68);
          goto LAB_001d6c08;
        }
        (**(code **)(**(long **)((long)local_68.disposer + 0x28) + 0x10))(&local_68);
      }
      (__return_storage_ptr__->ptr).isSet = true;
      *(Disposer **)&(__return_storage_ptr__->ptr).field_1 = local_68.disposer;
      (__return_storage_ptr__->ptr).field_1.value.size = (uint64_t)local_68.ptr;
      (__return_storage_ptr__->ptr).field_1.value.spaceUsed = local_58;
      (__return_storage_ptr__->ptr).field_1.value.lastModified.value.value = lStack_50;
      *(_Base_ptr *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = local_48;
      (__return_storage_ptr__->ptr).field_1.value.hashCode = (uint64_t)p_Stack_40;
    }
  }
LAB_001d6c08:
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
            ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
             &stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

Maybe<FsNode::Metadata> tryLstat(PathPtr path) const override {
    if (path.size() == 0) {
      return stat();
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        if (entry.node.is<FileNode>()) {
          return entry.node.get<FileNode>().file->stat();
        } else if (entry.node.is<DirectoryNode>()) {
          return entry.node.get<DirectoryNode>().directory->stat();
        } else if (entry.node.is<SymlinkNode>()) {
          auto& link = entry.node.get<SymlinkNode>();
          uint64_t hash = reinterpret_cast<uintptr_t>(link.content.begin());
          return FsNode::Metadata { FsNode::Type::SYMLINK, 0, 0, link.lastModified, 1, hash };
        } else {
          KJ_FAIL_ASSERT("unknown node type") { return kj::none; }
        }
      } else {
        return kj::none;
      }
    }